

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::enumerateDeviceLayers(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  TestLog *log;
  TestStatus *pTVar1;
  qpTestResult qVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  ulong uVar3;
  long lVar4;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layerNames;
  ResultCollector results;
  allocator<char> local_241;
  _Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  Context *local_210;
  TestStatus *local_208;
  undefined1 local_200 [80];
  MessageBuilder local_1b0;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"",(allocator<char> *)&local_240);
  local_208 = __return_storage_ptr__;
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_200,log,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_240,vki
             ,physicalDevice);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &local_1b0.m_str;
  lVar4 = 0;
  local_210 = context;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_240._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_240._M_impl.super__Vector_impl_data._M_start) / 0x208);
      uVar3 = uVar3 + 1) {
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::operator<<((ostream *)this,": ");
    ::vk::operator<<((ostream *)this,
                     (VkLayerProperties *)
                     ((local_240._M_impl.super__Vector_impl_data._M_start)->layerName + lVar4));
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               (local_240._M_impl.super__Vector_impl_data._M_start)->layerName + lVar4,&local_241);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    lVar4 = lVar4 + 0x208;
  }
  checkDuplicateLayers((ResultCollector *)local_200,&local_228);
  local_1b0.m_str = (ostringstream)0x0;
  local_1b0._9_7_ = 0;
  local_1b0.m_log = (TestLog *)&PTR__CheckIncompleteResult_00bf87c0;
  CheckIncompleteResult<vk::VkLayerProperties>::operator()
            ((CheckIncompleteResult<vk::VkLayerProperties> *)&local_1b0,local_210,
             (ResultCollector *)local_200,
             (long)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_200);
  std::__cxx11::string::string((string *)&local_1b0,(string *)(local_200 + 0x30));
  pTVar1 = local_208;
  local_208->m_code = qVar2;
  std::__cxx11::string::string((string *)&local_208->m_description,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            (&local_240);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_200);
  return pTVar1;
}

Assistant:

tcu::TestStatus enumerateDeviceLayers (Context& context)
{
	TestLog&						log			= context.getTestContext().getLog();
	tcu::ResultCollector			results		(log);
	const vector<VkLayerProperties>	properties	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());
	vector<string>					layerNames;

	for (size_t ndx = 0; ndx < properties.size(); ndx++)
	{
		log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

		layerNames.push_back(properties[ndx].layerName);
	}

	checkDuplicateLayers(results, layerNames);
	CheckEnumerateDeviceLayerPropertiesIncompleteResult()(context, results, layerNames.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}